

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

word Abc_Tt6Expand(word t,int *pCut0,int nCutSize0,int *pCut,int nCutSize)

{
  uint iVar;
  
  do {
    iVar = nCutSize0 - 1;
    do {
      if ((nCutSize < 1) || (nCutSize0 < 1)) {
        if (nCutSize0 == 0) {
          return t;
        }
        __assert_fail("k == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x732,"word Abc_Tt6Expand(word, int *, int, int *, int)");
      }
      nCutSize = nCutSize - 1;
    } while (pCut0[iVar] < pCut[(uint)nCutSize]);
    if (pCut[(uint)nCutSize] != pCut0[iVar]) {
      __assert_fail("pCut[i] == pCut0[k]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x72d,"word Abc_Tt6Expand(word, int *, int, int *, int)");
    }
    nCutSize0 = iVar;
    if (iVar < (uint)nCutSize) {
      t = Abc_Tt6SwapVars(t,iVar,nCutSize);
    }
  } while( true );
}

Assistant:

static inline word Abc_Tt6Expand( word t, int * pCut0, int nCutSize0, int * pCut, int nCutSize )
{
    int i, k;
    for ( i = nCutSize - 1, k = nCutSize0 - 1; i >= 0 && k >= 0; i-- )
    {
        if ( pCut[i] > pCut0[k] )
            continue;
        assert( pCut[i] == pCut0[k] );
        if ( k < i )
            t = Abc_Tt6SwapVars( t, k, i );
        k--;
    }
    assert( k == -1 );
    return t;
}